

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SAX2.c
# Opt level: O1

void xmlSAX2ProcessingInstruction(void *ctx,xmlChar *target,xmlChar *data)

{
  xmlNodePtr node;
  
  if (ctx == (void *)0x0) {
    return;
  }
  node = xmlNewDocPI(*(xmlDocPtr *)((long)ctx + 0x10),target,data);
  if (node != (xmlNodePtr)0x0) {
    xmlSAX2AppendChild((xmlParserCtxtPtr)ctx,node);
    return;
  }
  xmlCtxtErrMemory((xmlParserCtxtPtr)ctx);
  return;
}

Assistant:

void
xmlSAX2ProcessingInstruction(void *ctx, const xmlChar *target,
                      const xmlChar *data)
{
    xmlParserCtxtPtr ctxt = (xmlParserCtxtPtr) ctx;
    xmlNodePtr ret;

    if (ctx == NULL) return;

    ret = xmlNewDocPI(ctxt->myDoc, target, data);
    if (ret == NULL) {
        xmlSAX2ErrMemory(ctxt);
        return;
    }

    xmlSAX2AppendChild(ctxt, ret);
}